

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Func.cpp
# Opt level: O1

void __thiscall Func::EnsureEquivalentTypeGuards(Func *this)

{
  JitArenaAllocator *pJVar1;
  code *pcVar2;
  bool bVar3;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_00;
  FunctionJITTimeInfo *this_01;
  undefined4 *puVar4;
  EquivalentTypeGuardList *pEVar5;
  
  this_00 = JITTimeWorkItem::GetJITFunctionBody(this->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_00);
  this_01 = JITTimeWorkItem::GetJITTimeInfo(this->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
  bVar3 = Js::Phases::IsEnabled
                    ((Phases *)&DAT_015bbe90,EquivObjTypeSpecPhase,sourceContextId,functionId);
  if (bVar3) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Func.cpp"
                       ,0x63f,
                       "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::EquivObjTypeSpecPhase)), ((this)->GetSourceContextId()), ((this)->GetLocalFunctionId())))"
                       ,
                       "Why do we have equivalent type guards if we don\'t do equivalent object type spec?"
                      );
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  if (this->equivalentTypeGuards == (EquivalentTypeGuardList *)0x0) {
    pEVar5 = (EquivalentTypeGuardList *)new<Memory::JitArenaAllocator>(0x18,this->m_alloc,0x3f1274);
    pJVar1 = this->m_alloc;
    (pEVar5->super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListBase<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>.super_RealCount
    .count = 0;
    (pEVar5->super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>).
    super_SListBase<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>.
    super_SListNodeBase<Memory::ArenaAllocator>.next = (Type)pEVar5;
    (pEVar5->super_SList<Js::JitEquivalentTypeGuard_*,_Memory::ArenaAllocator,_RealCount>).allocator
         = &pJVar1->super_ArenaAllocator;
    this->equivalentTypeGuards = pEVar5;
  }
  return;
}

Assistant:

void
Func::EnsureEquivalentTypeGuards()
{
    AssertMsg(!PHASE_OFF(Js::EquivObjTypeSpecPhase, this), "Why do we have equivalent type guards if we don't do equivalent object type spec?");
    if (this->equivalentTypeGuards == nullptr)
    {
        this->equivalentTypeGuards = JitAnew(this->m_alloc, EquivalentTypeGuardList, this->m_alloc);
    }
}